

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O3

FT_Bool sfnt_get_name_id(TT_Face face,FT_UShort id,FT_Int *win,FT_Int *apple)

{
  ushort uVar1;
  int iVar2;
  FT_UShort *pFVar3;
  ulong uVar4;
  FT_Int *pFVar5;
  
  *win = -1;
  *apple = -1;
  uVar1 = face->num_names;
  if ((ulong)uVar1 != 0) {
    pFVar3 = &((face->name_table).names)->stringLength;
    uVar4 = 0;
    do {
      if ((pFVar3[-1] == id) && (*pFVar3 != 0)) {
        if (((TT_NameRec *)(pFVar3 + -4))->platformID == 1) {
          if (pFVar3[-3] == 0) {
            pFVar5 = apple;
            if (pFVar3[-2] != 0) {
              iVar2 = *apple;
              goto joined_r0x00247e42;
            }
            goto LAB_00247e44;
          }
        }
        else if ((((TT_NameRec *)(pFVar3 + -4))->platformID == 3) && (pFVar3[-3] < 2)) {
          pFVar5 = win;
          if (pFVar3[-2] != 0x409) {
            iVar2 = *win;
joined_r0x00247e42:
            if (iVar2 != -1) goto LAB_00247e47;
          }
LAB_00247e44:
          *pFVar5 = (FT_Int)uVar4;
        }
      }
LAB_00247e47:
      uVar4 = uVar4 + 1;
      pFVar3 = pFVar3 + 0x10;
    } while (uVar1 != uVar4);
  }
  if (-1 < *win) {
    return '\x01';
  }
  return -1 < *apple;
}

Assistant:

static FT_Bool
  sfnt_get_name_id( TT_Face    face,
                    FT_UShort  id,
                    FT_Int    *win,
                    FT_Int    *apple )
  {
    FT_Int  n;


    *win   = -1;
    *apple = -1;

    for ( n = 0; n < face->num_names; n++ )
    {
      TT_Name  name = face->name_table.names + n;


      if ( name->nameID == id && name->stringLength > 0 )
      {
        if ( IS_WIN( name ) && ( name->languageID == 0x409 || *win == -1 ) )
          *win = n;

        if ( IS_APPLE( name ) && ( name->languageID == 0 || *apple == -1 ) )
          *apple = n;
      }
    }

    return ( *win >= 0 ) || ( *apple >= 0 );
  }